

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O3

void pzshape::TPZShapeCube::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  TPZStack<int,_10> highsides;
  double local_a8;
  TPZManVector<int,_10> local_78;
  
  lVar8 = 8;
  do {
    if (nshape->fStore[lVar8 + -8] != 0) {
      iVar5 = pztopology::TPZCube::ContainedSideLocId((int)lVar8,0);
      iVar6 = pztopology::TPZCube::ContainedSideLocId((int)lVar8,1);
      lVar11 = (long)iVar5;
      if (((iVar5 < 0) ||
          (lVar7 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar7 <= lVar11)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1 = phi->fElem;
      lVar9 = (long)iVar6;
      if ((iVar6 < 0) || (lVar7 <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar7 <= lVar8) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1[lVar8] = pdVar1[lVar11] * pdVar1[lVar9];
      lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if (((lVar7 < 1) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar6 < 0) ||
          (lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar2 <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) || (lVar2 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 1) ||
         (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar6 < 0 || lVar3 <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1 = dphi->fElem;
      if ((lVar2 < 1) || (lVar3 <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar1[lVar2 * lVar8] =
           dphi->fElem[lVar7 * lVar11] * phi->fElem[lVar9] +
           phi->fElem[lVar11] * pdVar1[lVar2 * lVar9];
      if (((lVar2 < 2) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar6 < 0) ||
          (lVar7 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar7 <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) || (lVar7 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar7 < 2) ||
         (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar6 < 0 || lVar3 <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = dphi->fElem;
      if ((lVar7 < 2) || (lVar3 <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar7 * lVar8 + 1] =
           pdVar1[lVar2 * lVar11 + 1] * phi->fElem[lVar9] +
           phi->fElem[lVar11] * pdVar4[lVar7 * lVar9 + 1];
      if (((lVar7 < 3) || (iVar5 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar6 < 0) ||
          (lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar2 <= lVar9)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar5 < 0) || (lVar2 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 3) ||
         (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar6 < 0 || lVar3 <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar2 < 3) || (lVar3 <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[lVar2 * lVar8 + 2] =
           pdVar4[lVar7 * lVar11 + 2] * phi->fElem[lVar9] +
           phi->fElem[lVar11] * dphi->fElem[lVar9 * lVar2 + 2];
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x14) {
      lVar8 = 0x14;
      while( true ) {
        iVar5 = pztopology::TPZCube::ContainedSideLocId((int)lVar8,0);
        iVar6 = pztopology::TPZCube::ContainedSideLocId((int)lVar8,2);
        lVar11 = (long)iVar5;
        if (((iVar5 < 0) ||
            (lVar7 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar7 <= lVar11)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = phi->fElem;
        lVar9 = (long)iVar6;
        if ((iVar6 < 0) || (lVar7 <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar7 <= lVar8) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar8] = pdVar1[lVar11] * pdVar1[lVar9];
        lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if (((lVar7 < 1) || (iVar5 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((iVar6 < 0) ||
            (lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar2 <= lVar9)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((iVar5 < 0) || (lVar2 <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar2 < 1) ||
           (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
           iVar6 < 0 || lVar3 <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = dphi->fElem;
        if ((lVar2 < 1) || (lVar3 <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar2 * lVar8] =
             dphi->fElem[lVar7 * lVar11] * phi->fElem[lVar9] +
             phi->fElem[lVar11] * pdVar1[lVar2 * lVar9];
        if (((lVar2 < 2) || (iVar5 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((iVar6 < 0) ||
            (lVar7 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar7 <= lVar9)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((iVar5 < 0) || (lVar7 <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar7 < 2) ||
           (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
           iVar6 < 0 || lVar3 <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar4 = dphi->fElem;
        if ((lVar7 < 2) || (lVar3 <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar4[lVar7 * lVar8 + 1] =
             pdVar1[lVar2 * lVar11 + 1] * phi->fElem[lVar9] +
             phi->fElem[lVar11] * pdVar4[lVar7 * lVar9 + 1];
        if (((lVar7 < 3) || (iVar5 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((iVar6 < 0) ||
            (lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar2 <= lVar9)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((iVar5 < 0) || (lVar2 <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar2 < 3) ||
           (lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
           iVar6 < 0 || lVar3 <= lVar9)) break;
        if ((lVar2 < 3) || (lVar3 <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[lVar2 * lVar8 + 2] =
             pdVar4[lVar7 * lVar11 + 2] * phi->fElem[lVar9] +
             phi->fElem[lVar11] * dphi->fElem[lVar9 * lVar2 + 2];
        lVar8 = lVar8 + 1;
        if (lVar8 == 0x1a) {
          lVar8 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar8 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          if (lVar8 < 7) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar8 < 0x1b) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1[0x1a] = *pdVar1 * pdVar1[6];
          if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 7) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
          if (lVar11 < 7 || lVar8 < 1) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = dphi->fElem;
          if ((lVar8 < 1) || (lVar11 < 0x1b)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1[lVar8 * 0x1a] = *dphi->fElem * phi->fElem[6] + *phi->fElem * pdVar1[lVar8 * 6];
          if ((lVar8 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 7) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
          if (lVar11 < 7 || lVar8 < 2) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar4 = dphi->fElem;
          if ((lVar8 < 2) || (lVar11 < 0x1b)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar4[lVar8 * 0x1a + 1] = pdVar1[1] * phi->fElem[6] + *phi->fElem * pdVar4[lVar8 * 6 + 1]
          ;
          if ((lVar8 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((6 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
             (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
            lVar8 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar11 < 7 || lVar8 < 3) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar8 < 3) || (lVar11 < 0x1b)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar8 * 0x1a + 2] =
                 pdVar4[2] * phi->fElem[6] + *phi->fElem * dphi->fElem[lVar8 * 6 + 2];
            lVar8 = 8;
            do {
              TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
              pztopology::TPZCube::HigherDimensionSides((int)lVar8,(TPZStack<int,_10> *)&local_78);
              if (0 < (int)(uint)local_78.super_TPZVec<int>.fNElements) {
                uVar10 = 0;
                do {
                  iVar5 = local_78.super_TPZVec<int>.fStore[uVar10];
                  lVar11 = (long)iVar5;
                  if (((lVar11 < 0) ||
                      (lVar7 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                      lVar7 <= lVar11)) ||
                     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1 = phi->fElem;
                  if (lVar7 <= lVar8) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1[lVar8] = pdVar1[lVar11] + pdVar1[lVar8];
                  lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                  if ((lVar7 < 1) ||
                     (lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                     iVar5 < 0 || lVar9 <= lVar11)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1 = dphi->fElem;
                  if ((lVar7 < 1) || (lVar9 <= lVar8)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1[lVar7 * lVar8] = pdVar1[lVar7 * lVar11] + pdVar1[lVar7 * lVar8];
                  if ((lVar7 < 2) ||
                     (lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                     iVar5 < 0 || lVar9 <= lVar11)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((lVar7 < 2) || (lVar9 <= lVar8)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1[lVar7 * lVar8 + 1] = pdVar1[lVar7 * lVar11 + 1] + pdVar1[lVar7 * lVar8 + 1]
                  ;
                  if ((lVar7 < 3) ||
                     (lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                     iVar5 < 0 || lVar9 <= lVar11)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((lVar7 < 3) || (lVar9 <= lVar8)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pdVar1[lVar7 * lVar8 + 2] = pdVar1[lVar11 * lVar7 + 2] + pdVar1[lVar7 * lVar8 + 2]
                  ;
                  uVar10 = uVar10 + 1;
                } while (((uint)local_78.super_TPZVec<int>.fNElements & 0x7fffffff) != uVar10);
              }
              iVar5 = pztopology::TPZCube::SideDimension((int)lVar8);
              local_a8 = 4.0;
              if (iVar5 != 1) {
                if (iVar5 == 2) {
                  local_a8 = 16.0;
                }
                else {
                  local_a8 = (double)((uint)(iVar5 == 3) << 6);
                }
              }
              if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[lVar8] = phi->fElem[lVar8] * local_a8;
              lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar11 < 1) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar1 = dphi->fElem;
              lVar7 = lVar11 * lVar8;
              pdVar1[lVar7] = pdVar1[lVar7] * local_a8;
              if ((lVar11 < 2) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar1[lVar7 + 1] = pdVar1[lVar7 + 1] * local_a8;
              if ((lVar11 < 3) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar1[lVar7 + 2] = local_a8 * pdVar1[lVar7 + 2];
              TPZManVector<int,_10>::~TPZManVector(&local_78);
              lVar8 = lVar8 + 1;
              if (lVar8 == 0x1b) {
                return;
              }
            } while( true );
          }
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  } while( true );
}

Assistant:

void TPZShapeCube::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    int is;
    // contribute the ribs
    for(is=8; is<20; is++)
    {
        if(nshape[is-8] == 0) continue;
        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,1);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the faces
    for(is=20; is<26; is++)
    {

        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,2);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the volume
    for(is=26; is<27; is++)
    {

        int is1,is2;
        is1 = 0;
        is2 = 6;
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }

    // Make the generating shape functions linear and unitary
    for(is=8; is<27; is++)
    {
        TPZStack<int> highsides;
        HigherDimensionSides(is,highsides);
        int h, nh = highsides.NElements();
        for(h=0; h<nh; h++)
        {
            int hs = highsides[h];
            phi(is,0) += phi(hs,0);
            dphi(0,is) += dphi(0,hs);
            dphi(1,is) += dphi(1,hs);
            dphi(2,is) += dphi(2,hs);
        }
        int dim = SideDimension(is);
        int mult = (dim == 1) ? 4 : (dim == 2) ? 16 : (dim ==3) ? 64 : 0;
        phi(is,0) *= mult;
        dphi(0,is) *= mult;
        dphi(1,is) *= mult;
        dphi(2,is) *= mult;
    }

}